

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O0

void __thiscall
asio::detail::scoped_ptr<asio::io_context::work>::reset
          (scoped_ptr<asio::io_context::work> *this,work *p)

{
  void *pvVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    asio::io_context::work::~work((work *)0x1333a0);
    operator_delete(pvVar1);
  }
  *in_RDI = in_RSI;
  return;
}

Assistant:

void reset(T* p = 0)
  {
    delete p_;
    p_ = p;
  }